

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd.cpp
# Opt level: O3

void __thiscall NshCmdCopy_Success_Test::TestBody(NshCmdCopy_Success_Test *this)

{
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar1;
  nsh_cmd_t cmd_to;
  nsh_cmd_t cmd_from;
  AssertHelper local_68;
  Message local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  nsh_status nVar2;
  undefined4 in_stack_ffffffffffffffb4;
  internal in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  nsh_cmd_t local_30;
  
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = nsh_cmd_init(&local_30,"test",cmd_test_handler);
  local_68.data_._0_4_ = NSH_STATUS_OK;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            ((internal *)&stack0xffffffffffffffb8,
             "nsh_cmd_init(&cmd_from, cmd_test_name, &cmd_test_handler)","NSH_STATUS_OK",
             (nsh_status *)&local_60,(nsh_status *)&local_68);
  if (in_stack_ffffffffffffffb8 == (internal)0x0) {
    testing::Message::Message(&local_60);
    if (in_stack_ffffffffffffffc0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffc0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffc0;
    if ((long *)CONCAT44(local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (nsh_status_t)
                         local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (nsh_status_t)
                                     local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) + 8))();
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffc0;
    }
    if (in_stack_ffffffffffffffa8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&stack0xffffffffffffffc0;
    goto LAB_0011262e;
  }
  if (in_stack_ffffffffffffffc0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffc0,in_stack_ffffffffffffffc0);
  }
  local_68.data_._0_4_ = nsh_cmd_init_empty((nsh_cmd_t *)&stack0xffffffffffffffb8);
  nVar2 = NSH_STATUS_OK;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            ((internal *)&local_60,"nsh_cmd_init_empty(&cmd_to)","NSH_STATUS_OK",
             (nsh_status *)&local_68,(nsh_status *)&stack0xffffffffffffffb0);
  if (local_60.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (in_stack_ffffffffffffffa8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffa8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
               ,0x47,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&local_68);
LAB_00112606:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    if ((long *)CONCAT44(local_68.data_._4_4_,(nsh_status_t)local_68.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,(nsh_status_t)local_68.data_) + 8))();
    }
  }
  else {
    if (in_stack_ffffffffffffffa8 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffa8,in_stack_ffffffffffffffa8);
    }
    testing::internal::CmpHelperSTRNE
              ((char *)in_stack_ffffffffffffffc0,
               (char *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
               (char *)CONCAT44(in_stack_ffffffffffffffb4,nVar2),(char *)in_stack_ffffffffffffffa8);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (in_stack_ffffffffffffffa8 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (in_stack_ffffffffffffffa8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x49,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&local_68);
      goto LAB_00112606;
    }
    if (in_stack_ffffffffffffffa8 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffa8,in_stack_ffffffffffffffa8);
    }
    testing::internal::
    CmpHelperNE<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
              ((internal *)&local_60,"cmd_to.handler","cmd_from.handler",
               (_func_nsh_status_uint_char_ptr_ptr **)&stack0xffffffffffffffb8,
               (_func_nsh_status_uint_char_ptr_ptr **)&local_30);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (in_stack_ffffffffffffffa8 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (in_stack_ffffffffffffffa8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x4a,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&local_68);
      goto LAB_00112606;
    }
    if (in_stack_ffffffffffffffa8 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffa8,in_stack_ffffffffffffffa8);
    }
    nsh_cmd_copy((nsh_cmd_t *)&stack0xffffffffffffffb8,&local_30);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_60,"cmd_to.name","cmd_from.name",&stack0xffffffffffffffc0,
               local_30.name);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (in_stack_ffffffffffffffa8 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (in_stack_ffffffffffffffa8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x4e,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&local_68);
      goto LAB_00112606;
    }
    if (in_stack_ffffffffffffffa8 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffa8,in_stack_ffffffffffffffa8);
    }
    testing::internal::
    CmpHelperEQ<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
              ((internal *)&local_60,"cmd_to.handler","cmd_from.handler",
               (_func_nsh_status_uint_char_ptr_ptr **)&stack0xffffffffffffffb8,
               (_func_nsh_status_uint_char_ptr_ptr **)&local_30);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (in_stack_ffffffffffffffa8 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (in_stack_ffffffffffffffa8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x4f,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&local_68);
      goto LAB_00112606;
    }
  }
  if (in_stack_ffffffffffffffa8 ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffa8;
LAB_0011262e:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

TEST(NshCmdCopy, Success)
{
    nsh_cmd_t cmd_from;
    ASSERT_EQ(nsh_cmd_init(&cmd_from, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);

    nsh_cmd_t cmd_to;
    ASSERT_EQ(nsh_cmd_init_empty(&cmd_to), NSH_STATUS_OK);

    ASSERT_STRNE(cmd_to.name, cmd_from.name);
    ASSERT_NE(cmd_to.handler, cmd_from.handler);

    nsh_cmd_copy(&cmd_to, &cmd_from);

    ASSERT_STREQ(cmd_to.name, cmd_from.name);
    ASSERT_EQ(cmd_to.handler, cmd_from.handler);
}